

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbase64.h
# Opt level: O0

int base64_encode(uint8_t *dst,uint8_t *src,size_t *dst_len,size_t *src_len,int mode)

{
  uint8_t *puVar1;
  int local_64;
  size_t sStack_60;
  int ret;
  size_t len;
  int pad;
  uint8_t *dst_base;
  uint8_t *T;
  uint8_t *url_alphabet;
  uint8_t *rfc4648_alphabet;
  int mode_local;
  size_t *src_len_local;
  size_t *dst_len_local;
  uint8_t *src_local;
  uint8_t *dst_local;
  
  sStack_60 = 0;
  local_64 = 3;
  src_local = dst;
  if (src_len == (size_t *)0x0) {
    local_64 = 2;
  }
  else {
    sStack_60 = *src_len;
    rfc4648_alphabet._4_4_ = mode & 0xffffff1f;
    if (rfc4648_alphabet._4_4_ == 0) {
      dst_base = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
    }
    else {
      if (rfc4648_alphabet._4_4_ != 1) goto LAB_00136bea;
      dst_base = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_";
    }
    local_64 = 0;
    dst_len_local = (size_t *)src;
    for (; 2 < sStack_60; sStack_60 = sStack_60 - 3) {
      *src_local = dst_base[(int)(uint)(byte)*dst_len_local >> 2];
      src_local[1] = dst_base[(int)(((byte)*dst_len_local & 3) << 4 |
                                   (int)(uint)*(byte *)((long)dst_len_local + 1) >> 4)];
      src_local[2] = dst_base[(int)((*(byte *)((long)dst_len_local + 1) & 0xf) << 2 |
                                   (int)(uint)*(byte *)((long)dst_len_local + 2) >> 6)];
      src_local[3] = dst_base[(int)(*(byte *)((long)dst_len_local + 2) & 0x3f)];
      src_local = src_local + 4;
      dst_len_local = (size_t *)((long)dst_len_local + 3);
    }
    if (sStack_60 == 1) {
      *src_local = dst_base[(int)(uint)(byte)*dst_len_local >> 2];
      src_local[1] = dst_base[(int)(((byte)*dst_len_local & 3) << 4)];
      puVar1 = src_local + 2;
      if ((mode & 0x80U) != 0) {
        src_local[2] = '=';
        src_local[3] = '=';
        puVar1 = src_local + 4;
      }
    }
    else {
      puVar1 = src_local;
      if (sStack_60 == 2) {
        *src_local = dst_base[(int)(uint)(byte)*dst_len_local >> 2];
        src_local[1] = dst_base[(int)(((byte)*dst_len_local & 3) << 4 |
                                     (int)(uint)*(byte *)((long)dst_len_local + 1) >> 4)];
        src_local[2] = dst_base[(int)((*(byte *)((long)dst_len_local + 1) & 0xf) << 2)];
        puVar1 = src_local + 3;
        if ((mode & 0x80U) != 0) {
          src_local[3] = '=';
          puVar1 = src_local + 4;
        }
      }
    }
    src_local = puVar1;
    sStack_60 = 0;
  }
LAB_00136bea:
  if (dst_len != (size_t *)0x0) {
    *dst_len = (long)src_local - (long)dst;
  }
  if (src_len != (size_t *)0x0) {
    *src_len = *src_len - sStack_60;
  }
  return local_64;
}

Assistant:

static inline int base64_encode(uint8_t *dst, const uint8_t *src, size_t *dst_len, size_t *src_len, int mode)
{
    const uint8_t *rfc4648_alphabet            = (const uint8_t *)
        "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
    const uint8_t *url_alphabet                = (const uint8_t *)
        "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789-_";

    const uint8_t *T;
    uint8_t *dst_base = dst;
    int pad = mode & base64_enc_modifier_padding;
    size_t len = 0;
    int ret = BASE64_EMODE;

    if (!src_len) {
        ret = BASE64_EARGS;
        goto done;
    }
    len = *src_len;
    mode = mode & ~base64_modifier_mask;
    switch (mode) {
    case base64_mode_rfc4648:
        T = rfc4648_alphabet;
        break;
    case base64_mode_url:
        T = url_alphabet;
        break;
    default:
        /* Invalid mode. */
        goto done;
    }

    ret = BASE64_EOK;

    /* Encodes 4 destination bytes from 3 source bytes. */
    while (len >= 3) {
        dst[0] = T[((src[0] >> 2))];
        dst[1] = T[((src[0] << 4) & 0x30) | (src[1] >> 4)];
        dst[2] = T[((src[1] << 2) & 0x3c) | (src[2] >> 6)];
        dst[3] = T[((src[2] & 0x3f))];
        len -= 3;
        dst += 4;
        src += 3;
    }
    /* Encodes 8 destination bytes from 1 to 4 source bytes, if any. */
    switch(len) {
    case 2:
        dst[0] = T[((src[0] >> 2))];
        dst[1] = T[((src[0] << 4) & 0x30) | (src[1] >> 4)];
        dst[2] = T[((src[1] << 2) & 0x3c)];
        dst += 3;
        if (pad) {
            *dst++ = '=';
        }
        break;
    case 1:
        dst[0] = T[((src[0] >> 2))];
        dst[1] = T[((src[0] << 4) & 0x30)];
        dst += 2;
        if (pad) {
            *dst++ = '=';
            *dst++ = '=';
        }
        break;
    default:
        pad = 0;
        break;
    }
    len = 0;
done:
    if (dst_len) {
        *dst_len = (size_t)(dst - dst_base);
    }
    if (src_len) {
        *src_len -= len;
    }
    return ret;
}